

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

bool __thiscall miniros::master::NetAdapter::hasAccessTo(NetAdapter *this,HostInfo *host)

{
  bool bVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = &(host->addresses)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (host->addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var2;
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    bVar1 = network::NetAddress::isLocal((NetAddress *)(p_Var3 + 1));
    if (!bVar1) {
      bVar1 = matchNetAddress(this,(NetAddress *)(p_Var3 + 1));
      if (bVar1) break;
    }
  }
  return (_Rb_tree_header *)p_Var3 != p_Var2;
}

Assistant:

bool NetAdapter::hasAccessTo(const HostInfo& host) const
{
  for (const auto& address: host.addresses) {
    if (address.isLocal())
      continue;
    if (matchNetAddress(address))
      return true;
  }
  return false;
}